

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
arangodb::velocypack::arena<64UL,_8UL>::deallocate(arena<64UL,_8UL> *this,char *p,size_t n)

{
  bool bVar1;
  size_t sVar2;
  size_t in_RDX;
  char *in_RSI;
  arena<64UL,_8UL> *in_RDI;
  
  bVar1 = pointer_in_buffer(in_RDI,in_RSI);
  if (bVar1) {
    sVar2 = align_up(in_RDX);
    if (in_RSI + sVar2 == in_RDI->ptr_) {
      in_RDI->ptr_ = in_RSI;
    }
  }
  else {
    operator_delete(in_RSI);
  }
  return;
}

Assistant:

void arena<N, alignment>::deallocate(char* p, std::size_t n) noexcept {
  assert(pointer_in_buffer(ptr_) && "short_alloc has outlived arena");
  if (pointer_in_buffer(p)) {
    n = align_up(n);
    if (p + n == ptr_) ptr_ = p;
  } else
    ::operator delete(p);
}